

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O3

int imcomp_convert_tile_tdouble
              (fitsfile *outfptr,long row,void *tiledata,long tilelen,long tilenx,long tileny,
              int nullcheck,void *nullflagval,int nullval,int zbitpix,double scale,double zero,
              int *intlength,int *flag,double *bscale,double *bzero,int *status)

{
  double dVar1;
  clock_t cVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  char *err_message;
  long lVar6;
  FITSfile *pFVar7;
  double dVar8;
  int imaxval;
  int iminval;
  time_t local_38;
  
  iminval = 0;
  imaxval = 0;
  if ((((zero != 0.0) || (NAN(zero))) || (scale != 1.0)) ||
     ((NAN(scale) || (zbitpix != 0x20 && (zbitpix & 0xffffffdfU) != 0xffffffc0)))) {
    err_message = "Implicit datatype conversion is not supported when writing to compressed images";
LAB_001c89e3:
    ffpmsg(err_message);
    *status = 0x19d;
    iVar3 = 0x19d;
  }
  else {
    *intlength = 4;
    pFVar7 = outfptr->Fptr;
    if (pFVar7->cn_zscale < 1) {
      if ((pFVar7->quantize_level != 9999.0) || (NAN(pFVar7->quantize_level))) {
        imcomp_nulldoubles((double *)tiledata,tilelen,(int *)tiledata,nullcheck,*nullflagval,nullval
                           ,status);
      }
      else if ((nullcheck == 1) && (0 < tilelen)) {
        dVar8 = *nullflagval;
        lVar6 = 0;
        do {
          dVar1 = *(double *)((long)tiledata + lVar6 * 8);
          if ((dVar1 == dVar8) && (!NAN(dVar1) && !NAN(dVar8))) {
            *(undefined8 *)((long)tiledata + lVar6 * 8) = 0xffffffffffffffff;
          }
          lVar6 = lVar6 + 1;
        } while (tilelen != lVar6);
      }
    }
    else {
      if (nullcheck == 1) {
        dVar8 = *nullflagval;
      }
      else {
        dVar8 = -9.1191291391491e-36;
      }
      if (pFVar7->quantize_method - 1U < 2) {
        if (pFVar7->request_dither_seed == 0) {
          if (pFVar7->dither_seed == 0) {
            local_38 = time((time_t *)0x0);
            cVar2 = clock();
            pFVar7 = outfptr->Fptr;
            pFVar7->dither_seed = ((int)cVar2 / 10000 + (int)local_38 + pFVar7->curhdu) % 10000 + 1;
            ffuky(outfptr,0x1f,"ZDITHER0",&pFVar7->dither_seed,(char *)0x0,status);
          }
        }
        else if ((pFVar7->request_dither_seed < 0) && (pFVar7->dither_seed < 0)) {
          if (tilelen < 1) {
            iVar3 = 1;
          }
          else {
            lVar6 = 1;
            if (1 < tilelen * 8) {
              lVar6 = tilelen * 8;
            }
            uVar4 = 0;
            lVar5 = 0;
            do {
              uVar4 = uVar4 + *(byte *)((long)tiledata + lVar5);
              lVar5 = lVar5 + 1;
            } while (lVar6 != lVar5);
            iVar3 = (int)uVar4 + (int)(uVar4 / 10000) * -10000 + 1;
          }
          pFVar7->dither_seed = iVar3;
          ffuky(outfptr,0x1f,"ZDITHER0",&pFVar7->dither_seed,(char *)0x0,status);
        }
        pFVar7 = outfptr->Fptr;
        lVar6 = pFVar7->dither_seed + row + -1;
        iVar3 = pFVar7->quantize_method;
      }
      else {
        if (pFVar7->quantize_method != -1) {
          ffpmsg("Unknown subtractive dithering method.");
          err_message = "May need to install a newer version of CFITSIO.";
          goto LAB_001c89e3;
        }
        lVar6 = 0;
        iVar3 = -1;
      }
      iVar3 = fits_quantize_double
                        (lVar6,(double *)tiledata,tilenx,tileny,nullcheck,dVar8,
                         pFVar7->quantize_level,iVar3,(int *)tiledata,bscale,bzero,&iminval,&imaxval
                        );
      *flag = iVar3;
      if (1 < iVar3) {
        *status = iVar3;
        return iVar3;
      }
    }
    iVar3 = *status;
  }
  return iVar3;
}

Assistant:

int imcomp_convert_tile_tdouble(
    fitsfile *outfptr,
    long row,
    void *tiledata, 
    long tilelen,
    long tilenx,
    long tileny,
    int nullcheck,
    void *nullflagval,
    int nullval,
    int zbitpix,
    double scale,
    double zero,
    int *intlength,
    int *flag,
    double *bscale,
    double *bzero,
    int *status)
{
    /*  Prepare the input tile array of pixels for compression. */
    /*  Convert input double tile array in place to 4-byte ints for compression, */
    /*  If needed, convert 4 or 8-byte ints and do null value substitution. */
    /*  Note that the calling routine must have allocated the input array big enough */
    /* to be able to do this.  */

    int *idata;
    long irow, ii;
    double doublenull;
    unsigned char *usbbuff;
    unsigned long dithersum;
    int iminval = 0, imaxval = 0;  /* min and max quantized integers */

        /* datatype of input array is double.  We only support writing this datatype
           to a FITS image with BITPIX = -64 or -32, except we also support the special case where
	   BITPIX = 32 and BZERO = 0 and BSCALE = 1.  */

       if ((zbitpix != LONG_IMG && zbitpix != DOUBLE_IMG && zbitpix != FLOAT_IMG) || scale != 1.0 || zero != 0.) {
           ffpmsg("Implicit datatype conversion is not supported when writing to compressed images");
           return(*status = DATA_COMPRESSION_ERR);
       } 

           *intlength = 4;
           idata = (int *) tiledata;

          /* if the tile-compressed table contains zscale and zzero columns */
          /* then scale and quantize the input floating point data.    */
          /* Otherwise, just truncate the floats to integers.          */

          if ((outfptr->Fptr)->cn_zscale > 0)
          {
            if (nullcheck == 1)
	      doublenull = *(double *) (nullflagval);
	    else
	      doublenull = DOUBLENULLVALUE;

            /* quantize the double values into integers */
              if ((outfptr->Fptr)->quantize_method == SUBTRACTIVE_DITHER_1 ||
	          (outfptr->Fptr)->quantize_method == SUBTRACTIVE_DITHER_2) {

	          /* see if the dithering offset value needs to be initialized (see above) */                  
	          if ((outfptr->Fptr)->request_dither_seed == 0 && (outfptr->Fptr)->dither_seed == 0) {

		     (outfptr->Fptr)->dither_seed = 
		       (( (int)time(NULL) + ( (int) clock() / (int) (CLOCKS_PER_SEC / 100)) + (outfptr->Fptr)->curhdu) % 10000) + 1;
		     
                     /* update the header keyword with this new value */
		     fits_update_key(outfptr, TINT, "ZDITHER0", &((outfptr->Fptr)->dither_seed), 
	                        NULL, status);

	          } else if ((outfptr->Fptr)->request_dither_seed < 0 && (outfptr->Fptr)->dither_seed < 0) {

		     usbbuff = (unsigned char *) tiledata;
		     dithersum = 0;
		     for (ii = 0; ii < 8 * tilelen; ii++) {
		         dithersum += usbbuff[ii];
	             }
		     (outfptr->Fptr)->dither_seed = ((int) (dithersum % 10000)) + 1;
		
                     /* update the header keyword with this new value */
		     fits_update_key(outfptr, TINT, "ZDITHER0", &((outfptr->Fptr)->dither_seed), 
	                        NULL, status);
		  }

	          irow = row + (outfptr->Fptr)->dither_seed - 1; /* dither the quantized values */

	      } else if ((outfptr->Fptr)->quantize_method == -1) {
	          irow = 0;  /* do not dither the quantized values */
              } else {
                  ffpmsg("Unknown subtractive dithering method.");
                  ffpmsg("May need to install a newer version of CFITSIO.");
                  return(*status = DATA_COMPRESSION_ERR);
              }

            *flag = fits_quantize_double (irow, (double *) tiledata, tilenx, tileny,
               nullcheck, doublenull, (outfptr->Fptr)->quantize_level, 
	       (outfptr->Fptr)->quantize_method, idata,
               bscale, bzero, &iminval, &imaxval);

            if (*flag > 1)
		return(*status = *flag);
          }
          else if ((outfptr->Fptr)->quantize_level != NO_QUANTIZE)
	  {
	    /* if floating point pixels are not being losslessly compressed, then */
	    /* input float data is implicitly converted (truncated) to integers */
             if ((scale != 1. || zero != 0.))  /* must scale the values */
	       imcomp_nullscaledoubles((double *) tiledata, tilelen, idata, scale, zero,
	           nullcheck, *(double *) (nullflagval), nullval, status);
             else
	       imcomp_nulldoubles((double *) tiledata, tilelen, idata,
	           nullcheck, *(double *) (nullflagval), nullval,  status);
          }
          else if ((outfptr->Fptr)->quantize_level == NO_QUANTIZE)
	  {
	      /* just convert null values to NaNs in place, if necessary, then do lossless gzip compression */
		if (nullcheck == 1) {
	            imcomp_double2nan((double *) tiledata, tilelen, (LONGLONG *) tiledata,
	                *(double *) (nullflagval), status);
		}
          }
 
          return(*status);
}